

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O2

json_t * json_array(void)

{
  json_t *ptr;
  void *pvVar1;
  
  ptr = (json_t *)jsonp_malloc(0x20);
  if (ptr != (json_t *)0x0) {
    ptr->type = JSON_ARRAY;
    *(undefined8 *)(ptr + 4) = 0;
    *(undefined8 *)(ptr + 2) = 8;
    pvVar1 = jsonp_malloc(0x40);
    *(void **)(ptr + 6) = pvVar1;
    if (pvVar1 != (void *)0x0) {
      return ptr;
    }
    jsonp_free(ptr);
  }
  return (json_t *)0x0;
}

Assistant:

json_t *json_array(void) {
    json_array_t *array = jsonp_malloc(sizeof(json_array_t));
    if (!array)
        return NULL;
    json_init(&array->json, JSON_ARRAY);

    array->entries = 0;
    array->size = 8;

    array->table = jsonp_malloc(array->size * sizeof(json_t *));
    if (!array->table) {
        jsonp_free(array);
        return NULL;
    }

    return &array->json;
}